

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_default_vfs_seek(ma_vfs *pVFS,ma_vfs_file file,ma_int64 offset,ma_seek_origin origin)

{
  ma_seek_origin origin_local;
  ma_int64 offset_local;
  ma_vfs_file file_local;
  ma_vfs *pVFS_local;
  
  if (file == (ma_vfs_file)0x0) {
    pVFS_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    pVFS_local._4_4_ = ma_default_vfs_seek__stdio(pVFS,file,offset,origin);
  }
  return pVFS_local._4_4_;
}

Assistant:

static ma_result ma_default_vfs_seek(ma_vfs* pVFS, ma_vfs_file file, ma_int64 offset, ma_seek_origin origin)
{
    if (file == NULL) {
        return MA_INVALID_ARGS;
    }

#if defined(MA_WIN32) && defined(MA_WIN32_DESKTOP) && !defined(MA_NO_WIN32_FILEIO)
    return ma_default_vfs_seek__win32(pVFS, file, offset, origin);
#else
    return ma_default_vfs_seek__stdio(pVFS, file, offset, origin);
#endif
}